

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O3

void sznet::net::sockets::sz_shutdownwrite(sz_sock sockfd)

{
  int iVar1;
  SourceFile file;
  Logger local_fd8;
  
  iVar1 = shutdown(sockfd,1);
  if (iVar1 < 0) {
    file._8_8_ = 0xe;
    file.m_data = "SocketsOps.cpp";
    Logger::Logger(&local_fd8,file,0x126,false);
    if (0x19 < (uint)(((int)&local_fd8 + 0xfb0) - (int)local_fd8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fd8.m_impl.m_stream.m_buffer.m_cur,"sockets::sz_shutdownwrite",0x19);
      local_fd8.m_impl.m_stream.m_buffer.m_cur = local_fd8.m_impl.m_stream.m_buffer.m_cur + 0x19;
    }
    Logger::~Logger(&local_fd8);
  }
  return;
}

Assistant:

void sz_shutdownwrite(sz_sock sockfd)
{
#ifdef SZ_OS_WINDOWS
	if (::shutdown(sockfd, SD_SEND) < 0)
#else
	if (::shutdown(sockfd, SHUT_WR) < 0)
#endif
	{
		LOG_SYSERR << "sockets::sz_shutdownwrite";
	}
}